

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

Vec4 __thiscall tcu::astc::getBlockTestTypeColorScale(astc *this,BlockTestType testType)

{
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 uVar1;
  undefined8 in_XMM1_Qa;
  Vec4 VVar2;
  BlockTestType testType_local;
  
  if (testType == BLOCK_TEST_TYPE_VOID_EXTENT_HDR) {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,7.633122e-06);
    uVar1 = extraout_XMM0_Qa;
  }
  else if (testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15) {
    in_XMM1_Qa = 0x37801002;
    Vector<float,_4>::Vector((Vector<float,_4> *)this,1.5266243e-05,1.5266243e-05,1.5266243e-05,1.0)
    ;
    uVar1 = extraout_XMM0_Qa_00;
  }
  else if (testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15) {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,1.5266243e-05);
    uVar1 = extraout_XMM0_Qa_01;
  }
  else {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,1.0);
    uVar1 = extraout_XMM0_Qa_02;
  }
  VVar2.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar2.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar2.m_data[0] = (float)(int)uVar1;
  VVar2.m_data[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 getBlockTestTypeColorScale (BlockTestType testType)
{
	switch (testType)
	{
		case tcu::astc::BLOCK_TEST_TYPE_VOID_EXTENT_HDR:			return Vec4(0.5f/65504.0f);
		case tcu::astc::BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:	return Vec4(1.0f/65504.0f, 1.0f/65504.0f, 1.0f/65504.0f, 1.0f);
		case tcu::astc::BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:		return Vec4(1.0f/65504.0f);
		default:													return Vec4(1.0f);
	}
}